

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall pfederc::ModExpr::~ModExpr(ModExpr *this)

{
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&this->exprs);
  operator_delete(this,0x58);
  return;
}

Assistant:

std::string ModExpr::toString() const noexcept {
  std::string result = "module " + getIdentifier().toString(getLexer()) + '\n';
  for (const auto &expr : exprs) {
    result += expr->toString();
    result += '\n';
  }
  result += ';';
  return result;
}